

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int blobSeekToRow(Incrblob *p,sqlite3_int64 iRow,char **pzErr)

{
  int *piVar1;
  uint uVar2;
  sqlite3_stmt *psVar3;
  long *plVar4;
  sqlite3 *db;
  BtCursor *pBVar5;
  Btree *pBVar6;
  sqlite3_mutex *psVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  
  psVar3 = p->pStmt;
  *(sqlite3_int64 *)(*(long *)(psVar3 + 0x78) + 0x18) = iRow;
  iVar8 = sqlite3_step(p->pStmt);
  if (iVar8 == 100) {
    plVar4 = (long *)**(long **)(psVar3 + 0x70);
    uVar2 = *(uint *)(plVar4[0xe] + (long)p->iCol * 4);
    if (0xb < uVar2) {
      p->iOffset = *(int *)(plVar4[0xf] + (long)p->iCol * 4);
      p->nByte = uVar2 - 0xc >> 1;
      pBVar5 = (BtCursor *)*plVar4;
      p->pCsr = pBVar5;
      sqlite3BtreeEnter(pBVar5->pBtree);
      pBVar5 = p->pCsr;
      sqlite3_free(pBVar5->aOverflow);
      pBVar5->aOverflow = (Pgno *)0x0;
      pBVar5->isIncrblobHandle = '\x01';
      pBVar6 = p->pCsr->pBtree;
      if (pBVar6->sharable != '\0') {
        piVar1 = &pBVar6->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          psVar7 = pBVar6->pBt->mutex;
          if (psVar7 != (sqlite3_mutex *)0x0) {
            (*sqlite3Config.mutex.xMutexLeave)(psVar7);
          }
          pBVar6->locked = '\0';
        }
      }
      pcVar10 = (char *)0x0;
      iVar8 = 0;
      goto LAB_001236f3;
    }
    pcVar10 = "integer";
    if (uVar2 == 7) {
      pcVar10 = "real";
    }
    pcVar9 = "null";
    if (uVar2 != 0) {
      pcVar9 = pcVar10;
    }
    pcVar10 = sqlite3MPrintf(p->db,"cannot open value of type %s",pcVar9);
    sqlite3_finalize(p->pStmt);
    p->pStmt = (sqlite3_stmt *)0x0;
  }
  else {
    if (p->pStmt == (sqlite3_stmt *)0x0) {
      pcVar10 = (char *)0x0;
      goto LAB_001236f3;
    }
    iVar8 = sqlite3_finalize(p->pStmt);
    p->pStmt = (sqlite3_stmt *)0x0;
    db = p->db;
    if (iVar8 != 0) {
      pcVar10 = sqlite3_errmsg(db);
      pcVar10 = sqlite3MPrintf(db,"%s",pcVar10);
      goto LAB_001236f3;
    }
    pcVar10 = sqlite3MPrintf(db,"no such rowid: %lld",iRow);
  }
  iVar8 = 1;
LAB_001236f3:
  *pzErr = pcVar10;
  return iVar8;
}

Assistant:

static int blobSeekToRow(Incrblob *p, sqlite3_int64 iRow, char **pzErr){
  int rc;                         /* Error code */
  char *zErr = 0;                 /* Error message */
  Vdbe *v = (Vdbe *)p->pStmt;

  /* Set the value of the SQL statements only variable to integer iRow. 
  ** This is done directly instead of using sqlite3_bind_int64() to avoid 
  ** triggering asserts related to mutexes.
  */
  assert( v->aVar[0].flags&MEM_Int );
  v->aVar[0].u.i = iRow;

  rc = sqlite3_step(p->pStmt);
  if( rc==SQLITE_ROW ){
    u32 type = v->apCsr[0]->aType[p->iCol];
    if( type<12 ){
      zErr = sqlite3MPrintf(p->db, "cannot open value of type %s",
          type==0?"null": type==7?"real": "integer"
      );
      rc = SQLITE_ERROR;
      sqlite3_finalize(p->pStmt);
      p->pStmt = 0;
    }else{
      p->iOffset = v->apCsr[0]->aOffset[p->iCol];
      p->nByte = sqlite3VdbeSerialTypeLen(type);
      p->pCsr =  v->apCsr[0]->pCursor;
      sqlite3BtreeEnterCursor(p->pCsr);
      sqlite3BtreeCacheOverflow(p->pCsr);
      sqlite3BtreeLeaveCursor(p->pCsr);
    }
  }

  if( rc==SQLITE_ROW ){
    rc = SQLITE_OK;
  }else if( p->pStmt ){
    rc = sqlite3_finalize(p->pStmt);
    p->pStmt = 0;
    if( rc==SQLITE_OK ){
      zErr = sqlite3MPrintf(p->db, "no such rowid: %lld", iRow);
      rc = SQLITE_ERROR;
    }else{
      zErr = sqlite3MPrintf(p->db, "%s", sqlite3_errmsg(p->db));
    }
  }

  assert( rc!=SQLITE_OK || zErr==0 );
  assert( rc!=SQLITE_ROW && rc!=SQLITE_DONE );

  *pzErr = zErr;
  return rc;
}